

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetSuccessfulPayment(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  type_conflict4 tVar3;
  undefined8 *puVar4;
  self_type *psVar5;
  iterator iVar6;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Ptr PVar8;
  Ptr PVar9;
  path_type local_98;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  locale local_48 [8];
  ptree *local_40;
  element_type *local_38;
  
  local_40 = data;
  puVar4 = (undefined8 *)operator_new(200);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_002a6db0;
  memset(puVar4 + 4,0,0xa8);
  puVar4[2] = puVar4 + 4;
  puVar4[3] = 0;
  puVar4[7] = puVar4 + 9;
  puVar4[0xb] = puVar4 + 0xd;
  puVar4[0xf] = 0;
  puVar4[0x10] = 0;
  puVar4[0x11] = puVar4 + 0x13;
  puVar4[0x15] = puVar4 + 0x17;
  *(undefined8 **)(this + 8) = puVar4;
  *(string **)this = (string *)(puVar4 + 2);
  paVar1 = &local_98.m_value.field_2;
  local_98.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"currency","");
  local_98.m_separator = '.';
  local_98.m_start._M_current = local_98.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_98);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_68,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar5);
  std::__cxx11::string::operator=((string *)(puVar4 + 2),(string *)&local_68);
  if ((undefined1 *)CONCAT44(uStack_64,local_68) != local_58) {
    operator_delete((undefined1 *)CONCAT44(uStack_64,local_68));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_value._M_dataplus._M_p);
  }
  local_98.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"total_amount","");
  local_98.m_separator = '.';
  local_98.m_start._M_current = local_98.m_value._M_dataplus._M_p;
  local_38 = (element_type *)this;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_98);
  std::locale::locale(local_48);
  std::locale::locale((locale *)&local_68,local_48);
  tVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)psVar5,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_68);
  std::locale::~locale((locale *)&local_68);
  std::locale::~locale(local_48);
  *(type_conflict4 *)(puVar4 + 6) = tVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_value._M_dataplus._M_p);
  }
  local_98.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"invoice_payload","");
  local_98.m_separator = '.';
  local_98.m_start._M_current = local_98.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_98);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_68,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar5);
  std::__cxx11::string::operator=((string *)(puVar4 + 7),(string *)&local_68);
  if ((undefined1 *)CONCAT44(uStack_64,local_68) != local_58) {
    operator_delete((undefined1 *)CONCAT44(uStack_64,local_68));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_value._M_dataplus._M_p);
  }
  local_98.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"shipping_option_id","");
  local_98.m_separator = '.';
  local_98.m_start._M_current = local_98.m_value._M_dataplus._M_p;
  psVar5 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_98);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (&local_68,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)psVar5);
  std::__cxx11::string::operator=((string *)(puVar4 + 0xb),(string *)&local_68);
  if ((undefined1 *)CONCAT44(uStack_64,local_68) != local_58) {
    operator_delete((undefined1 *)CONCAT44(uStack_64,local_68));
  }
  peVar2 = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_value._M_dataplus._M_p);
  }
  local_98.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"order_info","");
  iVar6 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string...,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,std::__cxx11::string_const,&std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>::first>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<2,std::pair<std::__cxx11::string_const,boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_non_unique<boost::multi_index::tag<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string___,boost::multi_index::detail::ordered_non_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)((long)in_RDX->m_children + 0x10),&local_98.m_value);
  if (iVar6.node ==
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        **)((long)in_RDX->m_children + 8)) {
    local_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    _Var7._M_pi = extraout_RDX;
  }
  else {
    PVar8 = parseJsonAndGetOrderInfo((TgTypeParser *)&local_68,local_40);
    _Var7 = PVar8.super___shared_ptr<TgBot::OrderInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[0x10];
  *(undefined4 *)(puVar4 + 0xf) = local_68;
  *(undefined4 *)((long)puVar4 + 0x7c) = uStack_64;
  *(undefined4 *)(puVar4 + 0x10) = uStack_60;
  *(undefined4 *)((long)puVar4 + 0x84) = uStack_5c;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var7._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.m_value._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX_01;
  }
  PVar9.super___shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  PVar9.super___shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (Ptr)PVar9.super___shared_ptr<TgBot::SuccessfulPayment,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SuccessfulPayment::Ptr TgTypeParser::parseJsonAndGetSuccessfulPayment(const boost::property_tree::ptree& data) const {
    auto result(make_shared<SuccessfulPayment>());
    result->currency = data.get<string>("currency");
    result->totalAmount = data.get<int32_t>("total_amount");
    result->invoicePayload = data.get<string>("invoice_payload");
    result->shippingOptionId = data.get<string>("shipping_option_id");
    result->orderInfo = tryParseJson(&TgTypeParser::parseJsonAndGetOrderInfo, data, "order_info");
    return result;
}